

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  __pid_t _Var3;
  int *piVar4;
  long *plVar5;
  undefined8 *puVar6;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  long *plVar7;
  stringstream *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  undefined8 uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int pipe_fd [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  long local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  int local_80;
  int local_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_54;
  string local_50;
  
  GTestLog::GTestLog((GTestLog *)&local_120,GTEST_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/gtest-1.7.0/src/gtest-death-test.cc"
                     ,0x339);
  Message::Message((Message *)&local_100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_100.ptr_ + 0x10),
             "Death tests use fork(), which is unsafe particularly",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_100.ptr_ + 0x10)," in a threaded context. For this test, ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_100.ptr_ + 0x10),"Google Test",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_100.ptr_ + 0x10)," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_100.ptr_ + 0x10),"couldn\'t detect the number of threads.",0x26);
  StringStreamToString(&local_e0,local_100.ptr_);
  if (local_100.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_100.ptr_ + 8))();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  paVar1 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  GTestLog::~GTestLog((GTestLog *)&local_120);
  iVar2 = pipe(&local_80);
  if (iVar2 == -1) {
    paVar15 = &local_68;
    local_78 = paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
    paVar13 = &local_b0;
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if (local_c0 == paVar14) {
      local_b0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_b0._8_8_ = puVar6[3];
      local_c0 = paVar13;
    }
    else {
      local_b0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_b8 = puVar6[1];
    *puVar6 = paVar14;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
    paVar14 = &local_130;
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if (local_140 == paVar9) {
      local_130._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_130._8_8_ = puVar6[3];
      local_140 = paVar14;
    }
    else {
      local_130._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_138 = puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x33d;
    StreamableToString<int>(&local_a0,(int *)&local_50);
    uVar12 = 0xf;
    if (local_140 != paVar14) {
      uVar12 = local_130._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_a0._M_string_length + local_138) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar12 = local_a0.field_2._M_allocated_capacity;
      }
      paVar9 = local_140;
      if (local_a0._M_string_length + local_138 <= (ulong)uVar12) goto LAB_0012ced4;
    }
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0._M_dataplus._M_p);
LAB_0012cee5:
    local_120 = (long *)*puVar6;
    plVar5 = puVar6 + 2;
    if (local_120 == plVar5) {
      local_110 = *plVar5;
      lStack_108 = puVar6[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar5;
    }
    local_118 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_100.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
    pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (plVar5 + 2);
    if (local_100.ptr_ == pbVar10) {
      local_f0 = *(long *)pbVar10;
      lStack_e8 = plVar5[3];
      local_100.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
    }
    else {
      local_f0 = *(long *)pbVar10;
    }
    local_f8 = plVar5[1];
    *plVar5 = (long)pbVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
    local_e0._M_dataplus._M_p = (pointer)*plVar5;
    psVar11 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_e0._M_dataplus._M_p == psVar11) {
      local_e0.field_2._M_allocated_capacity = *psVar11;
      local_e0.field_2._8_8_ = plVar5[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar11;
    }
    local_e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    DeathTestAbort(&local_e0);
    puVar6 = extraout_RAX_00;
    local_e0._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var3;
      if (_Var3 == 0) {
        do {
          iVar2 = close(local_80);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_7c;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        psVar11 = puVar6 + 2;
        if (local_78 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_68._M_allocated_capacity = *psVar11;
          local_68._8_8_ = puVar6[3];
          local_78 = &local_68;
        }
        else {
          local_68._M_allocated_capacity = *psVar11;
        }
        local_70 = puVar6[1];
        *puVar6 = psVar11;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
        local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_c0 == paVar15) {
          local_b0._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_b0._8_8_ = puVar6[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        }
        local_b8 = puVar6[1];
        *puVar6 = paVar15;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_54 = 0x34e;
        StreamableToString<int>(&local_50,&local_54);
        uVar12 = 0xf;
        if (local_c0 != &local_b0) {
          uVar12 = local_b0._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_50._M_string_length + local_b8) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
              &local_50.field_2) {
            uVar12 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_50._M_string_length + local_b8) goto LAB_0012c9bd;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_c0);
        }
        else {
LAB_0012c9bd:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_c0,
                              (ulong)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                              local_50._M_dataplus._M_p._0_4_));
        }
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_140 == paVar15) {
          local_130._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_130._8_8_ = puVar6[3];
          local_140 = &local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar15->_M_allocated_capacity;
        }
        local_138 = puVar6[1];
        *puVar6 = paVar15;
        puVar6[1] = 0;
        paVar15->_M_local_buf[0] = '\0';
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
        local_120 = (long *)*puVar6;
        plVar5 = puVar6 + 2;
        if (local_120 == plVar5) {
          local_110 = *plVar5;
          lStack_108 = puVar6[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar5;
        }
        local_118 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        local_100.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
        psVar8 = (stringstream *)(puVar6 + 2);
        if (local_100.ptr_ == psVar8) {
          local_f0 = *(long *)psVar8;
          lStack_e8 = puVar6[3];
          local_100.ptr_ = (stringstream *)&local_f0;
        }
        else {
          local_f0 = *(long *)psVar8;
        }
        local_f8 = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        local_e0._M_dataplus._M_p = (pointer)*puVar6;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar9) goto LAB_0012cea6;
        local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_e0.field_2._8_8_ = puVar6[3];
        local_e0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        do {
          iVar2 = close(local_7c);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_80;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar5;
        psVar11 = (size_type *)(plVar5 + 2);
        if (local_78 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_68._M_allocated_capacity = *psVar11;
          local_68._8_8_ = plVar5[3];
          local_78 = &local_68;
        }
        else {
          local_68._M_allocated_capacity = *psVar11;
        }
        local_70 = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar5;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar5 + 2);
        if (local_c0 == paVar15) {
          local_b0._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_b0._8_8_ = plVar5[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        }
        local_b8 = plVar5[1];
        *plVar5 = (long)paVar15;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_54 = 0x35a;
        StreamableToString<int>(&local_50,&local_54);
        uVar12 = 0xf;
        if (local_c0 != &local_b0) {
          uVar12 = local_b0._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_50._M_string_length + local_b8) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
              &local_50.field_2) {
            uVar12 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_50._M_string_length + local_b8) goto LAB_0012c834;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_c0);
        }
        else {
LAB_0012c834:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_c0,
                              (ulong)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                              local_50._M_dataplus._M_p._0_4_));
        }
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_140 == paVar15) {
          local_130._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_130._8_8_ = puVar6[3];
          local_140 = &local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar15->_M_allocated_capacity;
        }
        local_138 = puVar6[1];
        *puVar6 = paVar15;
        puVar6[1] = 0;
        paVar15->_M_local_buf[0] = '\0';
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_120 = (long *)*plVar5;
        plVar7 = plVar5 + 2;
        if (local_120 == plVar7) {
          local_110 = *plVar7;
          lStack_108 = plVar5[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar7;
        }
        local_118 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        local_100.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
        psVar8 = (stringstream *)(puVar6 + 2);
        if (local_100.ptr_ == psVar8) {
          local_f0 = *(long *)psVar8;
          lStack_e8 = puVar6[3];
          local_100.ptr_ = (stringstream *)&local_f0;
        }
        else {
          local_f0 = *(long *)psVar8;
        }
        local_f8 = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        local_e0._M_dataplus._M_p = (pointer)*puVar6;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p == paVar9) {
          local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_e0.field_2._8_8_ = puVar6[3];
          local_e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_e0._M_string_length = puVar6[1];
        *puVar6 = paVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        DeathTestAbort(&local_e0);
        puVar6 = extraout_RAX;
        local_e0._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_0012cea6:
        local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      paVar15 = &local_a0.field_2;
      paVar14 = &local_b0;
      paVar13 = &local_68;
      local_e0._M_string_length = puVar6[1];
      *puVar6 = paVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      DeathTestAbort(&local_e0);
LAB_0012ced4:
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)paVar9);
      goto LAB_0012cee5;
    }
    paVar15 = &local_68;
    local_78 = paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
    paVar13 = &local_b0;
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if (local_c0 == paVar14) {
      local_b0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_b0._8_8_ = puVar6[3];
      local_c0 = paVar13;
    }
    else {
      local_b0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_b8 = puVar6[1];
    *puVar6 = paVar14;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
    paVar14 = &local_130;
    local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if (local_140 == paVar9) {
      local_130._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_130._8_8_ = puVar6[3];
      local_140 = paVar14;
    }
    else {
      local_130._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_138 = puVar6[1];
    *puVar6 = paVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x34b;
    StreamableToString<int>(&local_a0,(int *)&local_50);
    uVar12 = 0xf;
    if (local_140 != paVar14) {
      uVar12 = local_130._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_a0._M_string_length + local_138) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar12 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_a0._M_string_length + local_138) goto LAB_0012ce17;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_140);
    }
    else {
LAB_0012ce17:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0._M_dataplus._M_p);
    }
    local_120 = (long *)*puVar6;
    plVar5 = puVar6 + 2;
    if (local_120 == plVar5) {
      local_110 = *plVar5;
      lStack_108 = puVar6[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar5;
    }
    local_118 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    local_100.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
    pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (puVar6 + 2);
    if (local_100.ptr_ == pbVar10) {
      local_f0 = *(long *)pbVar10;
      lStack_e8 = puVar6[3];
      local_100.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
    }
    else {
      local_f0 = *(long *)pbVar10;
    }
    local_f8 = puVar6[1];
    *puVar6 = pbVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    local_e0._M_dataplus._M_p = (pointer)*puVar6;
    psVar11 = puVar6 + 2;
    if ((size_type *)local_e0._M_dataplus._M_p == psVar11) {
      local_e0.field_2._M_allocated_capacity = *psVar11;
      local_e0.field_2._8_8_ = puVar6[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      goto LAB_0012d0ce;
    }
  }
  local_e0.field_2._M_allocated_capacity = *psVar11;
LAB_0012d0ce:
  local_e0._M_string_length = puVar6[1];
  *puVar6 = psVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0) {
    operator_delete(local_100.ptr_);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_140 != paVar14) {
    operator_delete(local_140);
  }
  if (local_c0 != paVar13) {
    operator_delete(local_c0);
  }
  if (local_78 != paVar15) {
    operator_delete(local_78);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}